

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::FastPath(double significand,int exp)

{
  int in_EDI;
  double in_XMM0_Qa;
  undefined8 local_8;
  
  if (in_EDI < -0x134) {
    local_8 = 0.0;
  }
  else if (in_EDI < 0) {
    local_8 = Pow10(0);
    local_8 = in_XMM0_Qa / local_8;
  }
  else {
    local_8 = Pow10(0);
    local_8 = in_XMM0_Qa * local_8;
  }
  return local_8;
}

Assistant:

inline double FastPath(double significand, int exp) {
    if (exp < -308)
        return 0.0;
    else if (exp >= 0)
        return significand * internal::Pow10(exp);
    else
        return significand / internal::Pow10(-exp);
}